

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamStandardIndex::WriteHeader(BamStandardIndex *this)

{
  IBamIODevice *pIVar1;
  uint32_t val;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BamException *this_00;
  allocator local_5e;
  allocator local_5d;
  int32_t numReferences;
  string local_58;
  string local_38;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,"BAI\x01",4);
  numReferences =
       (int32_t)(((long)(this->m_indexFileSummary).
                        super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_indexFileSummary).
                       super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if (this->m_isBigEndian == true) {
    numReferences =
         (uint)numReferences >> 0x18 | (numReferences & 0xff0000U) >> 8 |
         (numReferences & 0xff00U) << 8 | numReferences << 0x18;
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&numReferences,4);
  if (CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 8) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamStandardIndex::WriteHeader",&local_5d);
  std::__cxx11::string::string((string *)&local_58,"could not write BAI header",&local_5e);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteHeader()
{

    int64_t numBytesWritten = 0;

    // write magic number
    numBytesWritten += m_resources.Device->Write(BamStandardIndex::BAI_MAGIC, 4);

    // write number of reference sequences
    int32_t numReferences = m_indexFileSummary.size();
    if (m_isBigEndian) {
        SwapEndian_32(numReferences);
    }
    numBytesWritten +=
        m_resources.Device->Write((const char*)&numReferences, sizeof(numReferences));

    if (numBytesWritten != sizeof(numReferences) + 4) {
        throw BamException("BamStandardIndex::WriteHeader", "could not write BAI header");
    }
}